

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_AddDirectory(TArray<FString,_FString> *wadfiles,char *dir)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t __n;
  void *handle_00;
  size_t local_2040;
  size_t stuffstart;
  void *handle;
  findstate_t findstate;
  char skindir [4096];
  char curdir [4096];
  char *dir_local;
  TArray<FString,_FString> *wadfiles_local;
  
  pcVar3 = getcwd(skindir + 0xff8,0x1000);
  if (pcVar3 != (char *)0x0) {
    __n = strlen(dir);
    memcpy(&findstate.current,dir,__n);
    skindir[__n - 8] = '\0';
    local_2040 = __n;
    if (skindir[__n - 9] == '/') {
      local_2040 = __n - 1;
      skindir[__n - 9] = '\0';
    }
    iVar1 = chdir((char *)&findstate.current);
    if (iVar1 == 0) {
      skindir[local_2040 - 8] = '/';
      handle_00 = I_FindFirst("*.wad",(findstate_t *)&handle);
      if (handle_00 != (void *)0xffffffffffffffff) {
        do {
          uVar2 = I_FindAttr((findstate_t *)&handle);
          if ((uVar2 & 8) == 0) {
            strcpy(skindir + (local_2040 - 7),
                   (char *)(*(long *)(findstate._0_8_ + (long)(int)findstate.namelist * 8) + 0x13));
            D_AddFile(wadfiles,(char *)&findstate.current,true,-1);
          }
          iVar1 = I_FindNext(handle_00,(findstate_t *)&handle);
        } while (iVar1 == 0);
        I_FindClose(handle_00);
      }
    }
    chdir(skindir + 0xff8);
  }
  return;
}

Assistant:

static void D_AddDirectory (TArray<FString> &wadfiles, const char *dir)
{
	char curdir[PATH_MAX];

	if (getcwd (curdir, PATH_MAX))
	{
		char skindir[PATH_MAX];
		findstate_t findstate;
		void *handle;
		size_t stuffstart;

		stuffstart = strlen (dir);
		memcpy (skindir, dir, stuffstart*sizeof(*dir));
		skindir[stuffstart] = 0;

		if (skindir[stuffstart-1] == '/')
		{
			skindir[--stuffstart] = 0;
		}

		if (!chdir (skindir))
		{
			skindir[stuffstart++] = '/';
			if ((handle = I_FindFirst ("*.wad", &findstate)) != (void *)-1)
			{
				do
				{
					if (!(I_FindAttr (&findstate) & FA_DIREC))
					{
						strcpy (skindir + stuffstart, I_FindName (&findstate));
						D_AddFile (wadfiles, skindir);
					}
				} while (I_FindNext (handle, &findstate) == 0);
				I_FindClose (handle);
			}
		}
		chdir (curdir);
	}
}